

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelFillsElement::~IfcRelFillsElement(IfcRelFillsElement *this)

{
  undefined1 *puVar1;
  
  this[-1].super_IfcRelConnects.super_IfcRelationship.super_IfcRoot.Name.ptr._M_dataplus._M_p =
       "0\aN";
  *(undefined8 *)
   &(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.field_0x20 = 0x926958;
  puVar1 = *(undefined1 **)
            &this[-1].super_IfcRelConnects.super_IfcRelationship.super_IfcRoot.field_0x98;
  if (puVar1 != &this[-1].super_IfcRelConnects.super_IfcRelationship.field_0xa8) {
    operator_delete(puVar1);
  }
  puVar1 = (undefined1 *)
           this[-1].super_IfcRelConnects.super_IfcRelationship.super_IfcRoot.Description.ptr.field_2
           ._M_allocated_capacity;
  if ((bool *)puVar1 !=
      &this[-1].super_IfcRelConnects.super_IfcRelationship.super_IfcRoot.Description.have) {
    operator_delete(puVar1);
  }
  puVar1 = (undefined1 *)
           this[-1].super_IfcRelConnects.super_IfcRelationship.super_IfcRoot.Name.ptr.field_2.
           _M_allocated_capacity;
  if ((bool *)puVar1 != &this[-1].super_IfcRelConnects.super_IfcRelationship.super_IfcRoot.Name.have
     ) {
    operator_delete(puVar1);
  }
  operator_delete(&this[-1].super_IfcRelConnects.super_IfcRelationship.super_IfcRoot.Name);
  return;
}

Assistant:

IfcRelFillsElement() : Object("IfcRelFillsElement") {}